

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O2

int libssh2_userauth_password_ex
              (LIBSSH2_SESSION *session,char *username,uint username_len,char *password,
              uint password_len,
              _func_void_LIBSSH2_SESSION_ptr_char_ptr_ptr_int_ptr_void_ptr_ptr *passwd_change_cb)

{
  int iVar1;
  libssh2_nonblocking_states lVar2;
  time_t start_time;
  uchar *puVar3;
  char *errmsg;
  bool bVar4;
  uchar *local_88;
  uchar **local_80;
  size_t *local_78;
  _func_void_LIBSSH2_SESSION_ptr_char_ptr_ptr_int_ptr_void_ptr_ptr *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  int *local_50;
  char **local_48;
  ulong local_40;
  size_t local_38;
  
  local_70 = passwd_change_cb;
  start_time = time((time_t *)0x0);
  local_38 = (size_t)(username_len + 0x28);
  local_78 = &session->userauth_pswd_data_len;
  local_80 = &session->userauth_pswd_data;
  local_48 = &session->userauth_pswd_newpw;
  local_50 = &session->userauth_pswd_newpw_len;
  local_58 = (ulong)(password_len + username_len + 0x2c);
  local_68 = (ulong)username_len;
  local_60 = (ulong)password_len;
  local_40 = (ulong)password_len;
  do {
    lVar2 = session->userauth_pswd_state;
    if (lVar2 == libssh2_NB_state_created) {
LAB_00128418:
      iVar1 = _libssh2_transport_send
                        (session,session->userauth_pswd_data,session->userauth_pswd_data_len,
                         (uchar *)password,local_60);
      if (iVar1 == -0x25) {
        iVar1 = -0x25;
        errmsg = "Would block writing password request";
      }
      else {
        (*session->free)(session->userauth_pswd_data,&session->abstract);
        session->userauth_pswd_data = (uchar *)0x0;
        if (iVar1 == 0) {
          do {
            session->userauth_pswd_state = libssh2_NB_state_sent;
            lVar2 = libssh2_NB_state_sent;
LAB_001284a2:
            if (2 < lVar2 - libssh2_NB_state_sent) {
              puVar3 = *local_80;
LAB_00128540:
              (*session->free)(puVar3,&session->abstract);
              session->userauth_pswd_data = (uchar *)0x0;
              session->userauth_pswd_state = libssh2_NB_state_idle;
              iVar1 = -0x12;
              errmsg = "Authentication failed";
              goto LAB_001286fb;
            }
            if (lVar2 == libssh2_NB_state_sent) {
              iVar1 = _libssh2_packet_requirev
                                (session,"43<",local_80,local_78,0,(uchar *)0x0,0,
                                 &session->userauth_pswd_packet_requirev_state);
              if (iVar1 != -0x25) {
                if (iVar1 == 0) {
                  if (*local_78 == 0) goto LAB_001286d2;
                  puVar3 = *local_80;
                  if (*puVar3 != '3') {
                    if (*puVar3 == '4') {
                      (*session->free)(puVar3,&session->abstract);
                      session->userauth_pswd_data = (uchar *)0x0;
                      *(byte *)&session->state = (byte)session->state | 8;
                      session->userauth_pswd_state = libssh2_NB_state_idle;
                      return 0;
                    }
                    session->userauth_pswd_newpw = (char *)0x0;
                    session->userauth_pswd_newpw_len = 0;
                    session->userauth_pswd_state = libssh2_NB_state_sent1;
                    bVar4 = true;
                    goto LAB_00128587;
                  }
                  (*session->free)(puVar3,&session->abstract);
                  session->userauth_pswd_data = (uchar *)0x0;
                  session->userauth_pswd_state = libssh2_NB_state_idle;
                  iVar1 = -0x12;
                  errmsg = "Authentication failed (username/password)";
                  goto LAB_001286fb;
                }
                session->userauth_pswd_state = libssh2_NB_state_idle;
              }
              errmsg = "Waiting for password response";
              goto LAB_001286fb;
            }
            if (*local_78 == 0) {
LAB_001286d2:
              session->userauth_pswd_state = libssh2_NB_state_idle;
              iVar1 = -0xe;
              errmsg = "Unexpected packet size";
              goto LAB_001286fb;
            }
            puVar3 = *local_80;
            bVar4 = lVar2 == libssh2_NB_state_sent1;
LAB_00128587:
            if ((*puVar3 != '<') && (session->userauth_pswd_data0 != '<')) goto LAB_00128540;
            session->userauth_pswd_data0 = '<';
            if (bVar4) {
              (*session->free)(puVar3,&session->abstract);
              session->userauth_pswd_data = (uchar *)0x0;
              puVar3 = (uchar *)0x0;
            }
            if (local_70 == (_func_void_LIBSSH2_SESSION_ptr_char_ptr_ptr_int_ptr_void_ptr_ptr *)0x0)
            goto LAB_00128540;
            if (session->userauth_pswd_state != libssh2_NB_state_sent2) {
              if (session->userauth_pswd_state != libssh2_NB_state_sent1) goto LAB_00128540;
              (*local_70)(session,local_48,local_50,&session->abstract);
              if (session->userauth_pswd_newpw == (char *)0x0) {
                iVar1 = -0xf;
                errmsg = "Password expired, and callback failed";
                goto LAB_001286fb;
              }
              session->userauth_pswd_data_len = local_58;
              local_88 = (uchar *)(*session->alloc)(local_58,&session->abstract);
              session->userauth_pswd_data = local_88;
              if (local_88 == (uchar *)0x0) {
                (*session->free)(session->userauth_pswd_newpw,&session->abstract);
                session->userauth_pswd_newpw = (char *)0x0;
                iVar1 = -6;
                errmsg = "Unable to allocate memory for userauth password change request";
                goto LAB_001286fb;
              }
              *local_88 = '2';
              local_88 = local_88 + 1;
              _libssh2_store_str(&local_88,username,local_68);
              _libssh2_store_str(&local_88,"ssh-connection",0xe);
              _libssh2_store_str(&local_88,"password",8);
              *local_88 = '\x01';
              local_88 = local_88 + 1;
              _libssh2_store_str(&local_88,password,local_60);
              _libssh2_store_u32(&local_88,session->userauth_pswd_newpw_len);
              session->userauth_pswd_state = libssh2_NB_state_sent2;
              puVar3 = session->userauth_pswd_data;
            }
            iVar1 = _libssh2_transport_send
                              (session,puVar3,session->userauth_pswd_data_len,
                               (uchar *)session->userauth_pswd_newpw,
                               (long)session->userauth_pswd_newpw_len);
            if (iVar1 == -0x25) {
              iVar1 = -0x25;
              errmsg = "Would block waiting";
              goto LAB_001286fb;
            }
            (*session->free)(session->userauth_pswd_data,&session->abstract);
            session->userauth_pswd_data = (uchar *)0x0;
            (*session->free)(session->userauth_pswd_newpw,&session->abstract);
            session->userauth_pswd_newpw = (char *)0x0;
          } while (iVar1 == 0);
          iVar1 = -7;
          errmsg = "Unable to send userauth password-change request";
        }
        else {
          session->userauth_pswd_state = libssh2_NB_state_idle;
          iVar1 = -7;
          errmsg = "Unable to send userauth-password request";
        }
      }
    }
    else {
      if (lVar2 != libssh2_NB_state_idle) goto LAB_001284a2;
      (session->userauth_pswd_packet_requirev_state).start = 0;
      session->userauth_pswd_data_len = local_38;
      session->userauth_pswd_data0 = 0xc3;
      puVar3 = (uchar *)(*session->alloc)(local_38,&session->abstract);
      session->userauth_pswd_data = puVar3;
      if (puVar3 != (uchar *)0x0) {
        local_88 = puVar3 + 1;
        *puVar3 = '2';
        _libssh2_store_str(&local_88,username,local_68);
        _libssh2_store_str(&local_88,"ssh-connection",0xe);
        _libssh2_store_str(&local_88,"password",8);
        *local_88 = '\0';
        local_88 = local_88 + 1;
        _libssh2_store_u32(&local_88,(uint32_t)local_40);
        session->userauth_pswd_state = libssh2_NB_state_created;
        goto LAB_00128418;
      }
      iVar1 = -6;
      errmsg = "Unable to allocate memory for userauth-password request";
    }
LAB_001286fb:
    iVar1 = _libssh2_error(session,iVar1,errmsg);
    if (iVar1 != -0x25) {
      return iVar1;
    }
    if (session->api_block_mode == 0) {
      return -0x25;
    }
    iVar1 = _libssh2_wait_socket(session,start_time);
    if (iVar1 != 0) {
      return iVar1;
    }
  } while( true );
}

Assistant:

LIBSSH2_API int
libssh2_userauth_password_ex(LIBSSH2_SESSION *session, const char *username,
                             unsigned int username_len, const char *password,
                             unsigned int password_len,
                             LIBSSH2_PASSWD_CHANGEREQ_FUNC
                             ((*passwd_change_cb)))
{
    int rc;
    BLOCK_ADJUST(rc, session,
                 userauth_password(session, username, username_len,
                                   (const unsigned char *)password,
                                   password_len,
                                   passwd_change_cb));
    return rc;
}